

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  TimeInMillis ms;
  char *data;
  String *in_stack_fffffffffffffde0;
  XmlUnitTestResultPrinter local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [8];
  string message;
  internal local_e8 [8];
  string location;
  XmlUnitTestResultPrinter local_c8;
  TestPartResult *part;
  int i;
  int failures;
  undefined1 local_98 [48];
  undefined1 local_68 [48];
  XmlUnitTestResultPrinter local_38;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_case_name_local;
  ostream *stream_local;
  
  result = (TestResult *)test_info;
  test_info_local = (TestInfo *)test_case_name;
  test_case_name_local = (char *)stream;
  local_38.output_file_.length_ = (size_t)TestInfo::result(test_info);
  poVar4 = std::operator<<((ostream *)test_case_name_local,"    <testcase name=\"");
  pcVar5 = TestInfo::name((TestInfo *)result);
  EscapeXmlAttribute(&local_38,pcVar5);
  pcVar5 = String::c_str((String *)&local_38);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\"");
  String::~String(in_stack_fffffffffffffde0);
  pcVar5 = TestInfo::value_param((TestInfo *)result);
  if (pcVar5 != (char *)0x0) {
    poVar4 = std::operator<<((ostream *)test_case_name_local," value_param=\"");
    pcVar5 = TestInfo::value_param((TestInfo *)result);
    EscapeXmlAttribute((XmlUnitTestResultPrinter *)(local_68 + 0x10),pcVar5);
    poVar4 = internal::operator<<(poVar4,(String *)(local_68 + 0x10));
    std::operator<<(poVar4,"\"");
    String::~String(in_stack_fffffffffffffde0);
  }
  pcVar5 = TestInfo::type_param((TestInfo *)result);
  if (pcVar5 != (char *)0x0) {
    poVar4 = std::operator<<((ostream *)test_case_name_local," type_param=\"");
    pcVar5 = TestInfo::type_param((TestInfo *)result);
    EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_68,pcVar5);
    poVar4 = internal::operator<<(poVar4,(String *)local_68);
    std::operator<<(poVar4,"\"");
    String::~String(in_stack_fffffffffffffde0);
  }
  poVar4 = std::operator<<((ostream *)test_case_name_local," status=\"");
  bVar1 = TestInfo::should_run((TestInfo *)result);
  pcVar5 = "notrun";
  if (bVar1) {
    pcVar5 = "run";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"\" time=\"");
  ms = TestResult::elapsed_time((TestResult *)local_38.output_file_.length_);
  FormatTimeInMillisAsSeconds_abi_cxx11_((internal *)(local_98 + 0x10),ms);
  poVar4 = std::operator<<(poVar4,(string *)(local_98 + 0x10));
  poVar4 = std::operator<<(poVar4,"\" classname=\"");
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_98,(char *)test_info_local);
  pcVar5 = String::c_str((String *)local_98);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"\"");
  TestPropertiesAsXmlAttributes
            ((XmlUnitTestResultPrinter *)&i,(TestResult *)local_38.output_file_.length_);
  pcVar5 = String::c_str((String *)&i);
  std::operator<<(poVar4,pcVar5);
  String::~String(in_stack_fffffffffffffde0);
  String::~String(in_stack_fffffffffffffde0);
  std::__cxx11::string::~string((string *)(local_98 + 0x10));
  part._4_4_ = 0;
  for (part._0_4_ = 0; iVar3 = (int)part,
      iVar2 = TestResult::total_part_count((TestResult *)local_38.output_file_.length_),
      iVar3 < iVar2; part._0_4_ = (int)part + 1) {
    local_c8.output_file_.length_ =
         (size_t)TestResult::GetTestPartResult
                           ((TestResult *)local_38.output_file_.length_,(int)part);
    bVar1 = TestPartResult::failed((TestPartResult *)local_c8.output_file_.length_);
    if (bVar1) {
      part._4_4_ = part._4_4_ + 1;
      if (part._4_4_ == 1) {
        std::operator<<((ostream *)test_case_name_local,">\n");
      }
      poVar4 = std::operator<<((ostream *)test_case_name_local,"      <failure message=\"");
      pcVar5 = TestPartResult::summary((TestPartResult *)local_c8.output_file_.length_);
      EscapeXmlAttribute(&local_c8,pcVar5);
      pcVar5 = String::c_str((String *)&local_c8);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4,"\" type=\"\">");
      String::~String(in_stack_fffffffffffffde0);
      pcVar5 = TestPartResult::file_name((TestPartResult *)local_c8.output_file_.length_);
      iVar3 = TestPartResult::line_number((TestPartResult *)local_c8.output_file_.length_);
      FormatCompilerIndependentFileLocation_abi_cxx11_(local_e8,pcVar5,iVar3);
      std::operator+(local_128,(char *)local_e8);
      in_stack_fffffffffffffde0 =
           (String *)TestPartResult::message((TestPartResult *)local_c8.output_file_.length_);
      std::operator+(local_108,(char *)local_128);
      std::__cxx11::string::~string((string *)local_128);
      pcVar5 = test_case_name_local;
      RemoveInvalidXmlCharacters(&local_148,local_108);
      data = (char *)std::__cxx11::string::c_str();
      OutputXmlCDataSection((ostream *)pcVar5,data);
      std::__cxx11::string::~string((string *)&local_148);
      std::operator<<((ostream *)test_case_name_local,"</failure>\n");
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)local_e8);
    }
  }
  if (part._4_4_ == 0) {
    std::operator<<((ostream *)test_case_name_local," />\n");
  }
  else {
    std::operator<<((ostream *)test_case_name_local,"    </testcase>\n");
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string message = location + "\n" + part.message();
      OutputXmlCDataSection(stream,
                            RemoveInvalidXmlCharacters(message).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}